

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_gather_offsets
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  NegativeTestContext *pNVar1;
  bool bVar2;
  deBool dVar3;
  RenderContext *pRVar4;
  NotSupportedError *this;
  char *__s;
  TextureGatherOffsetsTestSpec *in_R8;
  bool local_41a;
  bool local_419;
  string local_418;
  undefined1 local_3f8 [8];
  string shaderSource;
  int specNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  int local_390;
  allocator<char> local_389;
  int shaderNdx;
  undefined1 local_368 [8];
  TextureGatherOffsetsTestSpec testSpecs [28];
  allocator<char> local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  while( true ) {
    dVar3 = ::deGetFalse();
    bVar2 = false;
    local_419 = false;
    if (dVar3 == 0) {
      pRVar4 = NegativeTestContext::getRenderContext(local_10);
      local_14.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
      local_18 = (deUint32)glu::ApiType::es(3,2);
      bVar2 = glu::contextSupports(local_14,(ApiType)local_18);
      pNVar1 = local_10;
      local_41a = true;
      bVar2 = !bVar2;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"GL_EXT_gpu_shader5",&local_39);
        local_41a = NegativeTestContext::isExtensionSupported(pNVar1,&local_38);
      }
      local_419 = local_41a;
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
    }
    if (((local_419 ^ 0xffU) & 1) != 0) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      memcpy(local_368,&DAT_02c265d0,0x310);
      pNVar1 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shaderNdx,"textureGatherOffsets",&local_389);
      NegativeTestContext::beginSection(pNVar1,(string *)&shaderNdx);
      std::__cxx11::string::~string((string *)&shaderNdx);
      std::allocator<char>::~allocator(&local_389);
      for (local_390 = 0; local_390 < 6; local_390 = local_390 + 1) {
        bVar2 = NegativeTestContext::isShaderSupported
                          (local_10,*(ShaderType *)
                                     (NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_390 * 4));
        pNVar1 = local_10;
        if (bVar2) {
          __s = glu::getShaderTypeName
                          (*(ShaderType *)
                            (NegativeTestShared::(anonymous_namespace)::s_shaders +
                            (long)local_390 * 4));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&specNdx,__s,
                     (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          std::operator+(&local_3b0,"Verify shader: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &specNdx);
          NegativeTestContext::beginSection(pNVar1,&local_3b0);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&specNdx);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          for (shaderSource.field_2._8_4_ = 0; (int)shaderSource.field_2._8_4_ < 0x1c;
              shaderSource.field_2._8_4_ = shaderSource.field_2._8_4_ + 1) {
            NegativeTestShared::(anonymous_namespace)::
            genShaderSourceTextureGatherOffsets_abi_cxx11_
                      ((string *)local_3f8,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_390 * 4),
                       (int)local_368 + shaderSource.field_2._8_4_ * 0x1c,in_R8);
            pNVar1 = local_10;
            shaderType = *(ShaderType *)
                          (NegativeTestShared::(anonymous_namespace)::s_shaders +
                          (long)local_390 * 4);
            std::__cxx11::string::string((string *)&local_418,(string *)local_3f8);
            verifyShader(pNVar1,shaderType,&local_418);
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)local_3f8);
          }
          NegativeTestContext::endSection(local_10);
        }
      }
      NegativeTestContext::endSection(local_10);
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a context version 3.2 or higher.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(\"GL_EXT_gpu_shader5\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
             ,0x10c3);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void texture_gather_offsets (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported("GL_EXT_gpu_shader5"),
		"This test requires a context version 3.2 or higher.");

	const struct TextureGatherOffsetsTestSpec testSpecs[] =
	{
			//mode										samplerDataType						pDataType				offsetsDataType			fourthArgument		offsetIsConst	offsetArraySize
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
	};

	ctx.beginSection("textureGatherOffsets");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int specNdx = 0; specNdx < DE_LENGTH_OF_ARRAY(testSpecs); ++specNdx)
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffsets(ctx, s_shaders[shaderNdx], testSpecs[specNdx]));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}